

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O0

int resBS2(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector *yyS,N_Vector *ypS,N_Vector yyB,
          N_Vector ypB,N_Vector rrBS,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  long in_RDX;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  double dVar18;
  sunrealtype p1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  UserData data;
  sunrealtype l21;
  sunrealtype s3;
  sunrealtype s2;
  sunrealtype s1;
  sunrealtype mp2;
  sunrealtype mp1;
  sunrealtype lp2;
  sunrealtype lp1;
  sunrealtype m3;
  sunrealtype m2;
  sunrealtype m1;
  sunrealtype l3;
  sunrealtype l2;
  sunrealtype l1;
  sunrealtype p3;
  sunrealtype p2;
  
  dVar1 = *(double *)y2;
  dVar2 = *(double *)((long)y2 + 8);
  dVar3 = *(double *)((long)y2 + 0x10);
  dVar4 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar5 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x10);
  dVar6 = **(double **)(*in_R8 + 0x10);
  dVar7 = *(double *)(*(long *)(*in_R8 + 0x10) + 8);
  dVar8 = *(double *)(*(long *)(*in_R8 + 0x10) + 0x10);
  dVar9 = *(double *)(*(long *)(*in_R8 + 0x10) + 0x18);
  dVar10 = *(double *)(*(long *)(*in_R8 + 0x10) + 0x20);
  dVar11 = *(double *)(*(long *)(*in_R8 + 0x10) + 0x28);
  dVar12 = *(double *)(*(long *)(*in_R9 + 0x10) + 8);
  dVar13 = *(double *)(*(long *)(*in_R9 + 0x10) + 0x18);
  dVar14 = *(double *)(*(long *)(*in_R9 + 0x10) + 0x20);
  dVar15 = **(double **)(**(long **)(in_RDX + 8) + 0x10);
  dVar16 = *(double *)(*(long *)(**(long **)(in_RDX + 8) + 0x10) + 8);
  dVar17 = *(double *)(*(long *)(**(long **)(in_RDX + 8) + 0x10) + 0x10);
  dVar18 = dVar7 - dVar6;
  **(double **)(*(long *)y3 + 0x10) =
       ((dVar1 * dVar18 + **(double **)(*in_R9 + 0x10)) - dVar8) + **(double **)(*in_RDI + 0x10);
  *(double *)(*(long *)(*(long *)y3 + 0x10) + 8) =
       ((-(dVar3 * 2.0 * dVar4) * dVar7 + -(dVar2 * dVar5) * dVar18 + dVar12) - dVar8) + dVar4;
  *(double *)(*(long *)(*(long *)y3 + 0x10) + 0x10) = -dVar2 * dVar4 * dVar18 + -dVar8 + dVar5;
  *(double *)(*(long *)(*(long *)y3 + 0x10) + 0x18) =
       ((dVar1 * (-dVar9 + dVar10) + dVar13) - dVar11) + dVar15;
  *(double *)(*(long *)(*(long *)y3 + 0x10) + 0x20) =
       -(dVar2 * dVar17 + dVar3 * 2.0 * dVar16 + dVar5) * dVar7 +
       (dVar2 * dVar17 + dVar5) * dVar6 +
       ((-(dVar2 * dVar5 + dVar3 * 2.0 * dVar4) * dVar10 + dVar2 * dVar5 * dVar9 + dVar14) - dVar11)
       + dVar16;
  *(double *)(*(long *)(*(long *)y3 + 0x10) + 0x28) =
       -(dVar2 * dVar16 + dVar4) * dVar18 + dVar2 * dVar4 * (dVar9 - dVar10) + -dVar11 + dVar17;
  return 0;
}

Assistant:

static int resBS2(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector* yyS,
                  N_Vector* ypS, N_Vector yyB, N_Vector ypB, N_Vector rrBS,
                  void* user_dataB)

{
  UserData data;
  sunrealtype y1, y2, y3;
  sunrealtype p1, p2, p3;
  sunrealtype l1, l2, l3, m1, m2, m3;
  sunrealtype lp1, lp2, mp1, mp2;
  sunrealtype s1, s2, s3;
  sunrealtype l21;

  data = (UserData)user_dataB;

  /* The parameters. */
  p1 = data->p[0];
  p2 = data->p[1];
  p3 = data->p[2];

  /* The y vector. */
  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  /* The lambda vector. */
  l1 = Ith(yyB, 1);
  l2 = Ith(yyB, 2);
  l3 = Ith(yyB, 3);
  /* The mu vector. */
  m1 = Ith(yyB, 4);
  m2 = Ith(yyB, 5);
  m3 = Ith(yyB, 6);

  /* The lambda dot vector. */
  lp1 = Ith(ypB, 1);
  lp2 = Ith(ypB, 2);

  /* The mu dot vector. */
  mp1 = Ith(ypB, 4);
  mp2 = Ith(ypB, 5);

  /* The sensitivity with respect to p2 */
  s1 = Ith(yyS[1], 1);
  s2 = Ith(yyS[1], 2);
  s3 = Ith(yyS[1], 3);

  /* Temporary variables */
  l21 = l2 - l1;

  Ith(rrBS, 1) = lp1 + p1 * l21 - l3 + y1;
  Ith(rrBS, 2) = lp2 - p2 * y3 * l21 - TWO * p3 * y2 * l2 - l3 + y2;
  Ith(rrBS, 3) = -p2 * y2 * l21 - l3 + y3;

  Ith(rrBS, 4) = mp1 + p1 * (-m1 + m2) - m3 + s1;
  Ith(rrBS, 5) = mp2 + p2 * y3 * m1 - (p2 * y3 + TWO * p3 * y2) * m2 - m3 +
                 (y3 + p2 * s3) * l1 - (y3 + TWO * p3 * s2 + p2 * s3) * l2 + s2;
  Ith(rrBS, 6) = p2 * y2 * (m1 - m2) - m3 - (y2 + p2 * s2) * l21 + s3;

  return (0);
}